

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_quadrature.hpp
# Opt level: O2

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::
  quadrature_traits<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::AhrensBeylkin<double>_>,_void>
  ::generate(tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,
            Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
            *r,Quadrature<IntegratorXX::AhrensBeylkin<double>_> *a,point_type *cen)

{
  double dVar1;
  pointer pdVar2;
  pointer paVar3;
  pointer paVar4;
  long lVar5;
  long lVar6;
  size_t j;
  long lVar7;
  long lVar8;
  _Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  local_50;
  
  quadrature_traits<IntegratorXX::ProductQuadrature<IntegratorXX::detail::spherical_combine_op<double>,_IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::AhrensBeylkin<double>_>,_void>
  ::generate((tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&local_50,r,a);
  pdVar2 = (r->
           super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(r->
                super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  paVar3 = (a->
           super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           ).points_.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  paVar4 = (a->
           super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
           ).points_.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0;
  for (lVar7 = 0; lVar7 != ((long)paVar3 - (long)paVar4) / 0x18; lVar7 = lVar7 + 1) {
    for (lVar8 = 0; lVar6 >> 3 != lVar8; lVar8 = lVar8 + 1) {
      dVar1 = pdVar2[lVar8];
      *(double *)
       ((long)local_50.super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
              super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>.
              _M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar8 * 8 + lVar5) =
           dVar1 * dVar1 *
           *(double *)
            ((long)local_50.super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                   super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>.
                   _M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar8 * 8 + lVar5);
    }
    lVar5 = lVar5 + lVar6;
  }
  shift_grid(&local_50.
              super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
              ._M_head_impl,*(point_type *)cen->_M_elems);
  std::
  _Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&,void>
            ((_Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__,
             &local_50.
              super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
              ._M_head_impl,(vector<double,_std::allocator<double>_> *)&local_50);
  std::
  _Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~_Tuple_impl(&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( 
      const Quadrature<RadialQuad>&  r, 
      const Quadrature<AngularQuad>& a,
      const point_type&              cen
    ) {

    auto [points, weights] = prod_traits::generate(r, a); 

    const auto npr  = r.npts();
    const auto npa  = a.npts();

    const auto& rp = r.points();

    // Include Spherical Jacobian
    for( size_t j = 0; j < npa; ++j )
    for( size_t i = 0; i < npr; ++i ) {

      const auto ij = i + j * npr;
      weights[ij] *= rp[i] * rp[i];

    }

    // Recenter
    shift_grid( points, cen );

    return std::make_tuple( points, weights );

  }